

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::active_obj::impl::real_private_dispatcher_t::real_private_dispatcher_t
          (real_private_dispatcher_t *this,environment_t *env,string *data_sources_name_base,
          disp_params_t *params)

{
  pointer ppVar1;
  disp_params_t *params_local;
  string *data_sources_name_base_local;
  environment_t *env_local;
  real_private_dispatcher_t *this_local;
  
  private_dispatcher_t::private_dispatcher_t(&this->super_private_dispatcher_t);
  (this->super_private_dispatcher_t)._vptr_private_dispatcher_t =
       (_func_int **)&PTR__real_private_dispatcher_t_005c40b0;
  stdcpp::
  make_unique<so_5::disp::active_obj::impl::proxy_dispatcher_t,so_5::disp::active_obj::disp_params_t>
            ((stdcpp *)&this->m_disp,params);
  ppVar1 = std::
           unique_ptr<so_5::disp::active_obj::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_obj::impl::proxy_dispatcher_t>_>
           ::operator->(&this->m_disp);
  (*(ppVar1->super_proxy_dispatcher_base_t).super_actual_disp_iface_t.super_dispatcher_t.
    _vptr_dispatcher_t[5])(ppVar1,data_sources_name_base);
  ppVar1 = std::
           unique_ptr<so_5::disp::active_obj::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_obj::impl::proxy_dispatcher_t>_>
           ::operator->(&this->m_disp);
  (*(ppVar1->super_proxy_dispatcher_base_t).super_actual_disp_iface_t.super_dispatcher_t.
    _vptr_dispatcher_t[2])(ppVar1,env);
  return;
}

Assistant:

real_private_dispatcher_t(
			//! SObjectizer Environment to work in.
			environment_t & env,
			//! Value for creating names of data sources for
			//! run-time monitoring.
			const std::string & data_sources_name_base,
			//! Parameters for the dispatcher.
			disp_params_t params )
			:	m_disp( so_5::stdcpp::make_unique< proxy_dispatcher_t >(
					std::move( params ) ) )
			{
				m_disp->set_data_sources_name_base( data_sources_name_base );
				m_disp->start( env );
			}